

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

int Nf_StoCellIsDominated(Mio_Cell2_t *pCell,int *pFans,word *pProf)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  
  if (*pProf <= pCell->Area) {
    uVar3 = 0;
    do {
      if (*(uint *)&pCell->field_0x10 >> 0x1c == uVar3) {
        return 1;
      }
      puVar1 = (uint *)(pFans + uVar3);
      if ((int)*puVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      lVar2 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (pProf[lVar2] <= pCell->Delays[*puVar1 >> 1]);
  }
  return 0;
}

Assistant:

int Nf_StoCellIsDominated( Mio_Cell2_t * pCell, int * pFans, word * pProf )
{
    int k;
    if ( pCell->Area < pProf[0] )
        return 0;
    for ( k = 0; k < (int)pCell->nFanins; k++ )
        if ( pCell->Delays[Abc_Lit2Var(pFans[k])] < pProf[k+1] )
            return 0;
    return 1; // pCell is dominated
}